

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

bool __thiscall input_mod::SetSubsong(input_mod *this,int order)

{
  DUH_SIGRENDERER *pDVar1;
  bool bVar2;
  DUH_SIGRENDERER *oldsr;
  int order_local;
  input_mod *this_local;
  
  if (order == this->start_order) {
    this_local._7_1_ = false;
  }
  else {
    FCriticalSection::Enter(&this->crit_sec);
    pDVar1 = this->sr;
    this->sr = (DUH_SIGRENDERER *)0x0;
    this->start_order = order;
    bVar2 = open2(this,0);
    if (bVar2) {
      duh_end_sigrenderer((DUH_SIGRENDERER *)0x42aa53);
      FCriticalSection::Leave(&this->crit_sec);
      this_local._7_1_ = true;
    }
    else {
      this->sr = pDVar1;
      FCriticalSection::Leave(&this->crit_sec);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool input_mod::SetSubsong(int order)
{
	if (order == start_order)
	{
		return false;
	}
	crit_sec.Enter();
	DUH_SIGRENDERER *oldsr = sr;
	sr = NULL;
	start_order = order;
	if (!open2(0))
	{
		sr = oldsr;
		crit_sec.Leave();
		return false;
	}
	duh_end_sigrenderer(oldsr);
	crit_sec.Leave();
	return true;
}